

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O3

int readbits(int bitwidth,readblock_crap *crap)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  
  pbVar5 = crap->sourcepos;
  uVar1 = 0;
  if (pbVar5 < crap->sourceend) {
    iVar6 = crap->rembits;
    uVar1 = 0;
    iVar3 = 0;
    bVar2 = 0;
    if (iVar6 < bitwidth) {
      uVar1 = 0;
      pbVar4 = pbVar5;
      do {
        pbVar5 = pbVar4 + 1;
        crap->sourcepos = pbVar5;
        uVar1 = (uint)*pbVar4 << ((byte)iVar3 & 0x1f) | uVar1;
        if (crap->sourceend <= pbVar5) {
          return uVar1;
        }
        iVar3 = iVar3 + iVar6;
        bVar2 = (byte)iVar3;
        bitwidth = bitwidth - iVar6;
        crap->rembits = 8;
        iVar6 = 8;
        pbVar4 = pbVar5;
      } while (8 < bitwidth);
    }
    uVar1 = uVar1 | (~(-1 << ((byte)bitwidth & 0x1f)) & (uint)*pbVar5) << (bVar2 & 0x1f);
    *pbVar5 = *pbVar5 >> ((byte)bitwidth & 0x1f);
    crap->rembits = crap->rembits - bitwidth;
  }
  return uVar1;
}

Assistant:

static int readbits(int bitwidth, readblock_crap * crap)
{
	int val = 0;
	int b = 0;

	if (crap->sourcepos >= crap->sourceend) return val;

	while (bitwidth > crap->rembits) {
		val |= *crap->sourcepos++ << b;
		if (crap->sourcepos >= crap->sourceend) return val;
		b += crap->rembits;
		bitwidth -= crap->rembits;
		crap->rembits = 8;
	}

	val |= (*crap->sourcepos & ((1 << bitwidth) - 1)) << b;
	*crap->sourcepos >>= bitwidth;
	crap->rembits -= bitwidth;

	return val;
}